

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

cmSourceFile * __thiscall cmTarget::AddSource(cmTarget *this,string *src,bool before)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var2;
  const_iterator __position;
  pointer pcVar3;
  __normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  _Var4;
  size_type sVar5;
  cmSourceFile *pcVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  cmListFileBacktrace lfbt;
  cmSourceFileLocation sfl;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  size_type local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  element_type *local_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  value_type local_b0;
  cmSourceFileLocation local_80;
  
  cmSourceFileLocation::cmSourceFileLocation
            (&local_80,
             ((this->impl)._M_t.
              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t
              .super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
              super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile,src,Known);
  _Var2._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<BT<std::__cxx11::string>*,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_pred<TargetPropertyEntryFinder>>
                    (*(undefined8 *)
                      &((_Var2._M_head_impl)->SourceEntries).
                       super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ,*(pointer *)((long)&(_Var2._M_head_impl)->SourceEntries + 8),&local_80);
  _Var2._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  if (_Var4._M_current == *(pointer *)((long)&(_Var2._M_head_impl)->SourceEntries + 8)) {
    cmMakefile::GetBacktrace((_Var2._M_head_impl)->Makefile);
    _Var2._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    __position._M_current =
         *(BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> **)
          ((long)&(_Var2._M_head_impl)->SourceEntries + (ulong)!before * 8);
    pcVar3 = (src->_M_dataplus)._M_p;
    local_e0 = &local_d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e0,pcVar3,pcVar3 + src->_M_string_length);
    if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_b8->_M_use_count = local_b8->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_b8->_M_use_count = local_b8->_M_use_count + 1;
      }
    }
    paVar1 = &local_b0.Value.field_2;
    if (local_e0 == &local_d0) {
      local_b0.Value.field_2._8_8_ = local_d0._8_8_;
      local_b0.Value._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_b0.Value._M_dataplus._M_p = (pointer)local_e0;
    }
    local_b0.Value.field_2._M_allocated_capacity._1_7_ = local_d0._M_allocated_capacity._1_7_;
    local_b0.Value.field_2._M_local_buf[0] = local_d0._M_local_buf[0];
    local_b0.Value._M_string_length = local_d8;
    local_d8 = 0;
    local_d0._M_local_buf[0] = '\0';
    local_b0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = local_c0;
    local_b0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = local_b8;
    local_e0 = &local_d0;
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_M_insert_rval(&(_Var2._M_head_impl)->SourceEntries,__position,&local_b0);
    if (local_b0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                 TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.Value._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0.Value._M_dataplus._M_p,
                      local_b0.Value.field_2._M_allocated_capacity + 1);
    }
    if (local_e0 != &local_d0) {
      operator_delete(local_e0,CONCAT71(local_d0._M_allocated_capacity._1_7_,
                                        local_d0._M_local_buf[0]) + 1);
    }
    if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
    }
  }
  sVar5 = cmGeneratorExpression::Find(src);
  if (sVar5 == 0xffffffffffffffff) {
    pcVar6 = cmMakefile::GetOrCreateSource
                       (((this->impl)._M_t.
                         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                         .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile,
                        src,false,Known);
  }
  else {
    pcVar6 = (cmSourceFile *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.Name._M_dataplus._M_p != &local_80.Name.field_2) {
    operator_delete(local_80.Name._M_dataplus._M_p,local_80.Name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.Directory._M_dataplus._M_p != &local_80.Directory.field_2) {
    operator_delete(local_80.Directory._M_dataplus._M_p,
                    local_80.Directory.field_2._M_allocated_capacity + 1);
  }
  return pcVar6;
}

Assistant:

cmSourceFile* cmTarget::AddSource(const std::string& src, bool before)
{
  cmSourceFileLocation sfl(this->impl->Makefile, src,
                           cmSourceFileLocationKind::Known);
  if (std::find_if(
        this->impl->SourceEntries.begin(), this->impl->SourceEntries.end(),
        TargetPropertyEntryFinder(sfl)) == this->impl->SourceEntries.end()) {
    cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
    this->impl->SourceEntries.insert(before ? this->impl->SourceEntries.begin()
                                            : this->impl->SourceEntries.end(),
                                     BT<std::string>(src, lfbt));
  }
  if (cmGeneratorExpression::Find(src) != std::string::npos) {
    return nullptr;
  }
  return this->impl->Makefile->GetOrCreateSource(
    src, false, cmSourceFileLocationKind::Known);
}